

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall kratos::Const::to_string_abi_cxx11_(string *__return_storage_ptr__,Const *this)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  ulong local_48 [2];
  pointer local_38;
  size_type sStack_30;
  
  if (this->num_bits_ == 0) {
    if (((this->super_Var).is_signed_ == true) && (this->value_ < 0)) {
      uVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
      local_38 = (pointer)-this->value_;
      pcVar4 = "-{0}\'h{1:X}";
    }
    else {
      uVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
      local_38 = (pointer)this->value_;
      pcVar4 = "{0}\'h{1:X}";
    }
    local_48[0] = (ulong)uVar2;
    bVar5 = fmt::v7::to_string_view<char,_0>(pcVar4);
    sVar3 = 0x32;
  }
  else {
    bVar1 = this->negative_;
    uVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
    local_48[0] = (ulong)uVar2;
    if (bVar1 == true) {
      local_38 = (this->hex_value_)._M_dataplus._M_p;
      sStack_30 = (this->hex_value_)._M_string_length;
      pcVar4 = "-{0}\'h{1}";
    }
    else {
      local_38 = (this->hex_value_)._M_dataplus._M_p;
      sStack_30 = (this->hex_value_)._M_string_length;
      pcVar4 = "{0}\'h{1}";
    }
    bVar5 = fmt::v7::to_string_view<char,_0>(pcVar4);
    sVar3 = 0xd2;
  }
  format_str.data_ = (char *)bVar5.size_;
  format_str.size_ = sVar3;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_48;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar5.data_,format_str,args);
  return __return_storage_ptr__;
}

Assistant:

std::string Const::to_string() const {
    if (num_bits_ != 0) {
        // very big number
        if (negative_) {
            return ::format("-{0}\'h{1}", width(), hex_value_);
        } else {
            return ::format("{0}\'h{1}", width(), hex_value_);
        }
    } else if (is_signed_ && value_ < 0) {
        return ::format("-{0}\'h{1:X}", width(), -value_);
    } else {
        return ::format("{0}\'h{1:X}", width(), value_);
    }
}